

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureImageIterator::nextImage
          (TextureImageIterator *this)

{
  deUint32 dVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int i;
  long lVar8;
  undefined8 local_10;
  int local_8;
  
  iVar6 = this->m_currentLevel;
  bVar2 = iVar6 < this->m_levelCount + -1;
  iVar7 = this->m_currentImage;
  bVar3 = iVar7 < this->m_levelImageCount + -1;
  bVar4 = bVar3 || bVar2;
  if (!bVar3 && !bVar2) {
    return bVar4;
  }
  this->m_currentImage = iVar7 + 1;
  if (iVar7 + 1 != this->m_levelImageCount) {
    return bVar4;
  }
  this->m_currentLevel = iVar6 + 1;
  this->m_currentImage = 0;
  dVar1 = (this->m_info).m_target;
  local_8 = 0;
  local_10 = 0;
  bVar5 = (byte)(iVar6 + 1);
  if (dVar1 == 0x8c1a) {
    iVar6 = (this->m_info).m_size.m_data[0] >> (bVar5 & 0x1f);
    if (iVar6 < 2) {
      iVar6 = 1;
    }
    iVar7 = (this->m_info).m_size.m_data[1] >> (bVar5 & 0x1f);
    if (iVar7 < 2) {
      iVar7 = 1;
    }
    local_10 = CONCAT44(iVar7,iVar6);
    (this->m_levelSize).m_data[2] = (this->m_info).m_size.m_data[2];
    *(undefined8 *)(this->m_levelSize).m_data = local_10;
  }
  else {
    lVar8 = 0;
    do {
      iVar6 = (this->m_info).m_size.m_data[lVar8] >> (bVar5 & 0x1f);
      if (iVar6 < 2) {
        iVar6 = 1;
      }
      *(int *)((long)&local_10 + lVar8 * 4) = iVar6;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    (this->m_levelSize).m_data[2] = local_8;
    *(undefined8 *)(this->m_levelSize).m_data = local_10;
    iVar6 = 6;
    if (dVar1 == 0x8513) goto LAB_01666fef;
  }
  iVar6 = (this->m_levelSize).m_data[2];
LAB_01666fef:
  this->m_levelImageCount = iVar6;
  return bVar4;
}

Assistant:

bool				hasNextImage			(void) const					{ return (m_currentLevel < (m_levelCount - 1)) || m_currentImage < (m_levelImageCount - 1); }